

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_147e942::MiniscriptDescriptor::MakeScripts
          (vector<CScript,_std::allocator<CScript>_> *__return_storage_ptr__,
          MiniscriptDescriptor *this,vector<CPubKey,_std::allocator<CPubKey>_> *keys,
          Span<const_CScript> scripts,FlatSigningProvider *provider)

{
  uchar *puVar1;
  byte bVar2;
  MiniscriptContext MVar3;
  MiniscriptContext MVar4;
  uint uVar5;
  pointer pCVar6;
  Node<unsigned_int> *__args;
  uint *puVar7;
  ulong uVar8;
  long *plVar9;
  uint32_t *puVar10;
  char *pcVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  CScript *pCVar14;
  undefined1 uVar15;
  pointer puVar16;
  undefined8 uVar17;
  pointer pCVar18;
  ulong uVar19;
  long lVar20;
  uint *key;
  uint32_t *puVar21;
  long in_FS_OFFSET;
  Span<unsigned_char> output;
  Span<unsigned_char> output_00;
  vector<CScript,_std::allocator<CScript>_> results;
  vector<StackElem,_std::allocator<StackElem>_> stack;
  bool child_state;
  uint160 id;
  uint160 result;
  CScript script;
  vector<CScript,_std::allocator<CScript>_> local_1b8;
  void *local_198;
  void *pvStack_190;
  long local_188;
  bool local_179;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_178;
  opcodetype local_160 [2];
  ScriptMaker local_158;
  ScriptMaker *local_148;
  bool local_140 [8];
  direct_or_indirect local_138;
  uint local_11c;
  direct_or_indirect local_118;
  uint uStack_fc;
  char local_f8;
  CKeyID local_e8;
  uchar local_d4 [12];
  direct_or_indirect local_c8;
  size_type sStack_ac;
  direct_or_indirect local_a8;
  size_type sStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MVar3 = ((this->m_node).
           super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->m_script_ctx;
  pCVar18 = (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar6 = (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar18 != pCVar6) {
    if (TAPSCRIPT < MVar3) goto LAB_003b29aa;
    do {
      if (MVar3 == P2WSH) {
        CPubKey::GetID((CKeyID *)&local_a8.indirect_contents,pCVar18);
        std::
        _Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
        ::_M_emplace_unique<CKeyID,CPubKey_const&>
                  ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
                    *)&provider->pubkeys,(CKeyID *)&local_a8.indirect_contents,pCVar18);
      }
      else {
        local_118.indirect_contents.indirect = (char *)*(undefined8 *)(pCVar18->vch + 1);
        local_118._16_4_ = (undefined4)*(undefined8 *)(pCVar18->vch + 0x11);
        local_118._20_4_ = (undefined4)((ulong)*(undefined8 *)(pCVar18->vch + 0x11) >> 0x20);
        local_118._24_4_ = (undefined4)*(undefined8 *)(pCVar18->vch + 0x19);
        uStack_fc = (uint)((ulong)*(undefined8 *)(pCVar18->vch + 0x19) >> 0x20);
        local_118.indirect_contents.capacity = (size_type)*(undefined8 *)(pCVar18->vch + 9);
        local_118._12_4_ = (undefined4)((ulong)*(undefined8 *)(pCVar18->vch + 9) >> 0x20);
        local_c8.indirect_contents.indirect = (char *)0x0;
        local_c8.indirect_contents.capacity = 0;
        local_c8._12_4_ = 0;
        local_c8._16_4_ = 0;
        local_58 = 0;
        uStack_50 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_88 = 0;
        uStack_80 = 0;
        local_a8._16_4_ = 0;
        local_a8._20_4_ = 0;
        local_a8._24_4_ = 0;
        sStack_8c = 0;
        local_a8.indirect_contents.indirect = (char *)0x0;
        local_a8.indirect_contents.capacity = 0;
        local_a8._12_4_ = 0;
        local_48 = 0;
        CSHA256::CSHA256((CSHA256 *)&local_a8.indirect_contents);
        CSHA256::Write((CSHA256 *)&local_a8.indirect_contents,(uchar *)local_118.direct,0x20);
        output.m_size = 0x14;
        output.m_data = (uchar *)&local_c8;
        CHash160::Finalize((CHash160 *)&local_a8.indirect_contents,output);
        std::
        _Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
        ::_M_emplace_unique<uint160,CPubKey_const&>
                  ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
                    *)&provider->pubkeys,(uint160 *)&local_c8.indirect_contents,pCVar18);
      }
      pCVar18 = pCVar18 + 1;
    } while (pCVar18 != pCVar6);
  }
  __args = (this->m_node).
           super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  MVar4 = __args->m_script_ctx;
  local_158.m_keys = keys;
  local_158.m_script_ctx = MVar3;
  if (MVar4 == P2WSH) {
    local_140[0] = false;
  }
  else {
    if (MVar4 != TAPSCRIPT) {
LAB_003b29aa:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                    ,0xf6,"bool miniscript::IsTapscript(MiniscriptContext)");
    }
    local_140[0] = true;
  }
  local_148 = &local_158;
  local_179 = false;
  local_188 = 0;
  local_198 = (void *)0x0;
  pvStack_190 = (void *)0x0;
  local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.super__Vector_impl_data.
  _M_finish = (CScript *)0x0;
  local_a8.indirect_contents.indirect =
       (char *)((ulong)local_a8.indirect_contents.indirect & 0xffffffff00000000);
  std::
  vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<CScript,bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1},miniscript::Node<unsigned_int>::TreeEval<CScript,bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1}&,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<CScript>)#1}>(bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1}&,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespac...)#1})const::{lambda(bool&&,miniscript::Node<unsigned_int>const&,Span<CScript>)#1})const::StackElem>>
  ::emplace_back<miniscript::Node<unsigned_int>const&,int,bool>
            ((vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<CScript,bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_,miniscript::Node<unsigned_int>::TreeEval<CScript,bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_&,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,Span<CScript>)_1_>(bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_&,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespac___)_1_)const::_lambda(bool&&,miniscript::Node<unsigned_int>const&,Span<CScript>)_1_)const::StackElem>>
              *)&local_198,__args,(int *)local_a8.direct,&local_179);
  if (pvStack_190 != local_198) {
    do {
      puVar7 = *(uint **)((long)pvStack_190 + -0x18);
      uVar8 = *(ulong *)((long)pvStack_190 + -0x10);
      plVar9 = *(long **)(puVar7 + 0xe);
      uVar19 = *(long *)(puVar7 + 0x10) - (long)plVar9 >> 4;
      if (uVar8 < uVar19) {
        *(ulong *)((long)pvStack_190 + -0x10) = uVar8 + 1;
        uVar5 = *puVar7;
        uVar15 = *(undefined1 *)((long)pvStack_190 + -8);
        if (((uVar5 != 0xb) && (uVar15 = 1, uVar5 != 0xe)) &&
           (uVar15 = *(undefined1 *)((long)pvStack_190 + -8), uVar8 != 1 || uVar5 != 0x11)) {
          uVar15 = 0;
        }
        local_118.direct[0] = uVar15;
        local_a8.indirect_contents.indirect = (char *)((ulong)(uint)local_a8._4_4_ << 0x20);
        std::
        vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<CScript,bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1},miniscript::Node<unsigned_int>::TreeEval<CScript,bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1}&,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<CScript>)#1}>(bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1}&,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespac...)#1})const::{lambda(bool&&,miniscript::Node<unsigned_int>const&,Span<CScript>)#1})const::StackElem>>
        ::emplace_back<miniscript::Node<unsigned_int>const&,int,bool>
                  ((vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<CScript,bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_,miniscript::Node<unsigned_int>::TreeEval<CScript,bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_&,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,Span<CScript>)_1_>(bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_&,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespac___)_1_)const::_lambda(bool&&,miniscript::Node<unsigned_int>const&,Span<CScript>)_1_)const::StackElem>>
                    *)&local_198,(Node<unsigned_int> *)plVar9[uVar8 * 2],(int *)local_a8.direct,
                   (bool *)local_118.direct);
        goto LAB_003b2874;
      }
      if ((ulong)((long)local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                        super__Vector_impl_data._M_start >> 5) < uVar19) {
        __assert_fail("results.size() >= node.subs.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                      ,0x273,
                      "std::optional<Result> miniscript::Node<unsigned int>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = unsigned int, Result = CScript, State = bool, DownFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:731:23), UpFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:664:13)]"
                     );
      }
      if (0x1a < *puVar7) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                      ,799,
                      "auto miniscript::Node<unsigned int>::ToScript(const (anonymous namespace)::ScriptMaker &)::(anonymous class)::operator()(bool, const Node<Key> &, Span<CScript>) const [Key = unsigned int]"
                     );
      }
      pCVar14 = (CScript *)
                ((long)local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                       super__Vector_impl_data._M_start +
                uVar19 * -0x20 +
                ((long)local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                      super__Vector_impl_data._M_start));
      bVar2 = *(byte *)((long)pvStack_190 + -8);
      switch(*puVar7) {
      case 0:
        local_a8.indirect_contents.indirect = (char *)((ulong)(uint)local_a8._4_4_ << 0x20);
        BuildScript<opcodetype>
                  ((CScript *)&local_c8.indirect_contents,(opcodetype *)local_a8.direct);
        break;
      case 1:
        local_a8._0_4_ = 0x51;
        BuildScript<opcodetype>
                  ((CScript *)&local_c8.indirect_contents,(opcodetype *)local_a8.direct);
        break;
      case 2:
        ScriptMaker::ToPKBytes
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &local_a8.indirect_contents,local_148,**(uint32_t **)(puVar7 + 2));
        BuildScript<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((CScript *)&local_c8.indirect_contents,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &local_a8.indirect_contents);
        if (local_a8.indirect_contents.indirect != (char *)0x0) {
          puVar16 = (pointer)CONCAT44(local_a8._20_4_,local_a8._16_4_);
          uVar17 = local_a8.indirect_contents.indirect;
LAB_003b27ca:
          operator_delete((void *)uVar17,(long)puVar16 - uVar17);
        }
        break;
      case 3:
        local_160[1] = 0x76;
        local_160[0] = OP_HASH160;
        uVar5 = **(uint **)(puVar7 + 2);
        if (local_148->m_script_ctx == P2WSH) {
          CPubKey::GetID(&local_e8,
                         (local_148->m_keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>).
                         _M_impl.super__Vector_impl_data._M_start + uVar5);
        }
        else {
          if (local_148->m_script_ctx != TAPSCRIPT) goto LAB_003b29aa;
          pCVar18 = (local_148->m_keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar1 = pCVar18[uVar5].vch + 1;
          local_c8.indirect_contents.indirect = (char *)*(undefined8 *)puVar1;
          uVar17 = *(undefined8 *)(puVar1 + 8);
          puVar1 = pCVar18[uVar5].vch + 0x11;
          uVar12 = *(undefined8 *)puVar1;
          uVar13 = *(undefined8 *)(puVar1 + 8);
          local_c8._16_4_ = (undefined4)uVar12;
          local_c8._20_4_ = (undefined4)((ulong)uVar12 >> 0x20);
          local_c8._24_4_ = (undefined4)uVar13;
          sStack_ac = (size_type)((ulong)uVar13 >> 0x20);
          local_c8.indirect_contents.capacity = (size_type)uVar17;
          local_c8._12_4_ = (undefined4)((ulong)uVar17 >> 0x20);
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems[0] = '\0';
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems[1] = '\0';
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems[2] = '\0';
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems[3] = '\0';
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems[4] = '\0';
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems[5] = '\0';
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems[6] = '\0';
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems[7] = '\0';
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems[8] = '\0';
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems[9] = '\0';
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems[10] = '\0';
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
          local_58 = 0;
          uStack_50 = 0;
          local_68 = 0;
          uStack_60 = 0;
          local_78 = 0;
          uStack_70 = 0;
          local_88 = 0;
          uStack_80 = 0;
          local_a8._16_4_ = 0;
          local_a8._20_4_ = 0;
          local_a8._24_4_ = 0;
          sStack_8c = 0;
          local_a8.indirect_contents.indirect = (char *)0x0;
          local_a8.indirect_contents.capacity = 0;
          local_a8._12_4_ = 0;
          local_48 = 0;
          CSHA256::CSHA256((CSHA256 *)&local_a8.indirect_contents);
          CSHA256::Write((CSHA256 *)&local_a8.indirect_contents,(uchar *)local_c8.direct,0x20);
          output_00.m_size = 0x14;
          output_00.m_data = (uchar *)&local_e8;
          CHash160::Finalize((CHash160 *)&local_a8.indirect_contents,output_00);
        }
        std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_178,
                   (uchar *)&local_e8,local_d4,(allocator_type *)&local_a8.indirect_contents);
        local_a8._0_4_ = 0x88;
        BuildScript<opcodetype,opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,local_160 + 1,local_160,&local_178,
                   (opcodetype *)local_a8.direct);
        puVar16 = local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        uVar17 = local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
        if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_003b27ca;
        break;
      case 4:
        local_a8._0_4_ = 0xb2;
        BuildScript<unsigned_int_const&,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,puVar7 + 1,(opcodetype *)local_a8.direct);
        break;
      case 5:
        local_a8._0_4_ = 0xb1;
        BuildScript<unsigned_int_const&,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,puVar7 + 1,(opcodetype *)local_a8.direct);
        break;
      case 6:
        local_a8._0_4_ = 0x82;
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_178.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0x20);
        local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_ = 0x88;
        local_160[1] = 0xa8;
        local_160[0] = bVar2 + OP_EQUAL;
        BuildScript<opcodetype,int,opcodetype,opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,(opcodetype *)local_a8.direct,
                   (int *)&local_178,(opcodetype *)&local_e8,local_160 + 1,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(puVar7 + 8),local_160);
        break;
      case 7:
        local_a8._0_4_ = 0x82;
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_178.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0x20);
        local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_ = 0x88;
        local_160[1] = 0xaa;
        local_160[0] = bVar2 + OP_EQUAL;
        BuildScript<opcodetype,int,opcodetype,opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,(opcodetype *)local_a8.direct,
                   (int *)&local_178,(opcodetype *)&local_e8,local_160 + 1,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(puVar7 + 8),local_160);
        break;
      case 8:
        local_a8._0_4_ = 0x82;
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_178.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0x20);
        local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_ = 0x88;
        local_160[1] = 0xa6;
        local_160[0] = bVar2 + OP_EQUAL;
        BuildScript<opcodetype,int,opcodetype,opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,(opcodetype *)local_a8.direct,
                   (int *)&local_178,(opcodetype *)&local_e8,local_160 + 1,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(puVar7 + 8),local_160);
        break;
      case 9:
        local_a8._0_4_ = 0x82;
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_178.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0x20);
        local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_ = 0x88;
        local_160[1] = 0xa9;
        local_160[0] = bVar2 + OP_EQUAL;
        BuildScript<opcodetype,int,opcodetype,opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,(opcodetype *)local_a8.direct,
                   (int *)&local_178,(opcodetype *)&local_e8,local_160 + 1,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(puVar7 + 8),local_160);
        break;
      case 10:
        local_a8._0_4_ = 0x6b;
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_178.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0x6c);
        BuildScript<opcodetype,CScript&,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,(opcodetype *)local_a8.direct,pCVar14,
                   (opcodetype *)&local_178);
        break;
      case 0xb:
        local_a8._0_4_ = 0x7c;
        BuildScript<opcodetype,CScript&>
                  ((CScript *)&local_c8.indirect_contents,(opcodetype *)local_a8.direct,pCVar14);
        break;
      case 0xc:
        local_a8.indirect_contents.indirect = (char *)(CONCAT44(local_a8._4_4_,(uint)bVar2) | 0xac);
        BuildScript<CScript,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,pCVar14,(opcodetype *)local_a8.direct);
        break;
      case 0xd:
        local_a8._0_4_ = 0x76;
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_178.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,99);
        local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_ = 0x68;
        BuildScript<opcodetype,opcodetype,CScript&,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,(opcodetype *)local_a8.direct,
                   (opcodetype *)&local_178,pCVar14,(opcodetype *)&local_e8);
        break;
      case 0xe:
        if ((*(byte *)(*plVar9 + 0x91) & 0x20) == 0) {
          local_c8.indirect_contents.indirect =
               (pCVar14->super_CScriptBase)._union.indirect_contents.indirect;
          uVar17 = *(undefined8 *)((long)&(pCVar14->super_CScriptBase)._union + 8);
          uVar12 = *(undefined8 *)((long)&(pCVar14->super_CScriptBase)._union + 0x14);
          local_c8._16_4_ =
               (undefined4)
               ((ulong)*(undefined8 *)((long)&(pCVar14->super_CScriptBase)._union + 0xc) >> 0x20);
          local_c8._20_4_ = (undefined4)uVar12;
          local_c8._24_4_ = (undefined4)((ulong)uVar12 >> 0x20);
          local_c8.indirect_contents.capacity = (size_type)uVar17;
          local_c8._12_4_ = (undefined4)((ulong)uVar17 >> 0x20);
          sStack_ac = (pCVar14->super_CScriptBase)._size;
          (pCVar14->super_CScriptBase)._size = 0;
        }
        else {
          local_a8._0_4_ = 0x69;
          BuildScript<CScript,opcodetype>
                    ((CScript *)&local_c8.indirect_contents,pCVar14,(opcodetype *)local_a8.direct);
        }
        break;
      case 0xf:
        local_a8._0_4_ = 0x82;
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_178.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0x92);
        local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_ = 99;
        local_160[1] = 0x68;
        BuildScript<opcodetype,opcodetype,opcodetype,CScript&,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,(opcodetype *)local_a8.direct,
                   (opcodetype *)&local_178,(opcodetype *)&local_e8,pCVar14,local_160 + 1);
        break;
      case 0x10:
        local_a8._0_4_ = 0x92;
        BuildScript<CScript,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,pCVar14,(opcodetype *)local_a8.direct);
        break;
      case 0x11:
        BuildScript<CScript,CScript&>((CScript *)&local_c8.indirect_contents,pCVar14,pCVar14 + 1);
        break;
      case 0x12:
        local_a8._0_4_ = 0x9a;
        BuildScript<CScript,CScript&,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,pCVar14,pCVar14 + 1,
                   (opcodetype *)local_a8.direct);
        break;
      case 0x13:
        local_a8._0_4_ = 0x9b;
        BuildScript<CScript,CScript&,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,pCVar14,pCVar14 + 1,
                   (opcodetype *)local_a8.direct);
        break;
      case 0x14:
        local_a8._0_4_ = 100;
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_178.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0x68);
        BuildScript<CScript,opcodetype,CScript&,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,pCVar14,(opcodetype *)local_a8.direct,
                   pCVar14 + 1,(opcodetype *)&local_178);
        break;
      case 0x15:
        local_a8._0_4_ = 0x73;
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_178.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,100);
        local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_ = 0x68;
        BuildScript<CScript,opcodetype,opcodetype,CScript&,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,pCVar14,(opcodetype *)local_a8.direct,
                   (opcodetype *)&local_178,pCVar14 + 1,(opcodetype *)&local_e8);
        break;
      case 0x16:
        local_a8._0_4_ = 99;
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_178.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0x67);
        local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_ = 0x68;
        BuildScript<opcodetype,CScript&,opcodetype,CScript&,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,(opcodetype *)local_a8.direct,pCVar14,
                   (opcodetype *)&local_178,pCVar14 + 1,(opcodetype *)&local_e8);
        break;
      case 0x17:
        local_a8._0_4_ = 100;
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_178.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0x67);
        local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_ = 0x68;
        BuildScript<CScript,opcodetype,CScript&,opcodetype,CScript&,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,pCVar14,(opcodetype *)local_a8.direct,
                   pCVar14 + 2,(opcodetype *)&local_178,pCVar14 + 1,(opcodetype *)&local_e8);
        break;
      case 0x18:
        local_a8.indirect_contents.indirect =
             (pCVar14->super_CScriptBase)._union.indirect_contents.indirect;
        uVar17 = *(undefined8 *)((long)&(pCVar14->super_CScriptBase)._union + 8);
        uVar12 = *(undefined8 *)((long)&(pCVar14->super_CScriptBase)._union + 0x14);
        local_a8._16_4_ =
             (undefined4)
             ((ulong)*(undefined8 *)((long)&(pCVar14->super_CScriptBase)._union + 0xc) >> 0x20);
        local_a8._20_4_ = (undefined4)uVar12;
        local_a8._24_4_ = (undefined4)((ulong)uVar12 >> 0x20);
        local_a8.indirect_contents.capacity = (size_type)uVar17;
        local_a8._12_4_ = (undefined4)((ulong)uVar17 >> 0x20);
        sStack_8c = (pCVar14->super_CScriptBase)._size;
        (pCVar14->super_CScriptBase)._size = 0;
        if (1 < uVar19) {
          lVar20 = uVar19 - 1;
          pCVar14 = local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                    super__Vector_impl_data._M_finish + -uVar19;
          do {
            pCVar14 = pCVar14 + 1;
            local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_178.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,0x93);
            BuildScript<CScript,CScript&,opcodetype>
                      ((CScript *)&local_c8.indirect_contents,(CScript *)&local_a8.indirect_contents
                       ,pCVar14,(opcodetype *)&local_178);
            if (0x1c < sStack_8c) {
              free(local_a8.indirect_contents.indirect);
            }
            local_a8._16_4_ = local_c8._16_4_;
            local_a8._20_4_ = local_c8._20_4_;
            local_a8._24_4_ = local_c8._24_4_;
            local_a8.indirect_contents.indirect = local_c8.indirect_contents.indirect;
            local_a8.indirect_contents.capacity = local_c8.indirect_contents.capacity;
            local_a8._12_4_ = local_c8._12_4_;
            sStack_8c = sStack_ac;
            lVar20 = lVar20 + -1;
          } while (lVar20 != 0);
        }
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_178.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,bVar2 + 0x87);
        BuildScript<CScript,unsigned_int_const&,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,(CScript *)&local_a8.indirect_contents,
                   puVar7 + 1,(opcodetype *)&local_178);
        goto LAB_003b2702;
      case 0x19:
        local_a8.indirect_contents.indirect = (char *)(CONCAT71(local_a8._1_7_,local_140[0]) ^ 1);
        inline_check_non_fatal<bool>
                  ((bool *)local_a8.direct,
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                   ,0x308,"operator()","!is_tapscript");
        BuildScript<unsigned_int_const&>((CScript *)&local_a8.indirect_contents,puVar7 + 1);
        puVar10 = *(uint32_t **)(puVar7 + 4);
        for (puVar21 = *(uint32_t **)(puVar7 + 2); puVar21 != puVar10; puVar21 = puVar21 + 1) {
          ScriptMaker::ToPKBytes(&local_178,local_148,*puVar21);
          BuildScript<CScript,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((CScript *)&local_c8.indirect_contents,(CScript *)&local_a8.indirect_contents,
                     &local_178);
          if (0x1c < sStack_8c) {
            free(local_a8.indirect_contents.indirect);
          }
          local_a8._16_4_ = local_c8._16_4_;
          local_a8._20_4_ = local_c8._20_4_;
          local_a8._24_4_ = local_c8._24_4_;
          local_a8.indirect_contents.indirect = local_c8.indirect_contents.indirect;
          local_a8.indirect_contents.capacity = local_c8.indirect_contents.capacity;
          local_a8._12_4_ = local_c8._12_4_;
          sStack_8c = sStack_ac;
          sStack_ac = 0;
          if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_178.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_178.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_178.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(*(long *)(puVar7 + 4) - *(long *)(puVar7 + 2) >> 2);
        local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems._0_8_ =
             CONCAT44(local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems._4_4_,(uint)bVar2
                     ) | 0xae;
        BuildScript<CScript,unsigned_long,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,(CScript *)&local_a8.indirect_contents,
                   (unsigned_long *)&local_178,(opcodetype *)&local_e8);
        goto LAB_003b2702;
      case 0x1a:
        inline_check_non_fatal<bool_const&>
                  (local_140,
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                   ,0x310,"operator()","is_tapscript");
        ScriptMaker::ToPKBytes
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &local_c8.indirect_contents,local_148,**(uint32_t **)(puVar7 + 2));
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_178.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0xac);
        BuildScript<std::vector<unsigned_char,std::allocator<unsigned_char>>,opcodetype>
                  ((CScript *)&local_a8.indirect_contents,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &local_c8.indirect_contents,(opcodetype *)&local_178);
        if (local_c8.indirect_contents.indirect != (char *)0x0) {
          operator_delete(local_c8.indirect_contents.indirect,
                          CONCAT44(local_c8._20_4_,local_c8._16_4_) - local_c8._0_8_);
        }
        puVar21 = *(uint32_t **)(puVar7 + 2);
        while (puVar21 = puVar21 + 1, puVar21 != *(uint32_t **)(puVar7 + 4)) {
          ScriptMaker::ToPKBytes(&local_178,local_148,*puVar21);
          local_e8.super_uint160.super_base_blob<160U>.m_data._M_elems._0_4_ = 0xba;
          BuildScript<CScript,std::vector<unsigned_char,std::allocator<unsigned_char>>,opcodetype>
                    ((CScript *)&local_c8.indirect_contents,(CScript *)&local_a8.indirect_contents,
                     &local_178,(opcodetype *)&local_e8);
          if (0x1c < sStack_8c) {
            free(local_a8.indirect_contents.indirect);
          }
          local_a8.indirect_contents.indirect = local_c8.indirect_contents.indirect;
          local_a8._16_4_ = local_c8._16_4_;
          local_a8._20_4_ = local_c8._20_4_;
          local_a8._24_4_ = local_c8._24_4_;
          local_a8.indirect_contents.capacity = local_c8.indirect_contents.capacity;
          local_a8._12_4_ = local_c8._12_4_;
          sStack_8c = sStack_ac;
          sStack_ac = 0;
          if (local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_178.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_178.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_178.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        local_178.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(CONCAT44(local_178.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,(uint)bVar2) | 0x9c);
        BuildScript<CScript,unsigned_int_const&,opcodetype>
                  ((CScript *)&local_c8.indirect_contents,(CScript *)&local_a8.indirect_contents,
                   puVar7 + 1,(opcodetype *)&local_178);
LAB_003b2702:
        if (0x1c < sStack_8c) {
          free(local_a8.indirect_contents.indirect);
          local_a8.indirect_contents.indirect = (char *)0x0;
        }
      }
      local_118._16_4_ = local_c8._16_4_;
      local_118._20_4_ = local_c8._20_4_;
      local_118._24_4_ = local_c8._24_4_;
      local_118.indirect_contents.indirect = local_c8.indirect_contents.indirect;
      local_118.indirect_contents.capacity = local_c8.indirect_contents.capacity;
      local_118._12_4_ = local_c8._12_4_;
      uStack_fc = sStack_ac;
      local_f8 = '\x01';
      std::vector<CScript,_std::allocator<CScript>_>::_M_erase
                (&local_1b8,
                 (CScript *)
                 ((long)local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                        super__Vector_impl_data._M_finish +
                 (*(long *)(puVar7 + 0x10) - *(long *)(puVar7 + 0xe)) * -2),
                 (iterator)
                 local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
                (&local_1b8,(CScript *)&local_118.indirect_contents);
      pvStack_190 = (void *)((long)pvStack_190 + -0x18);
      if ((local_f8 == '\x01') && (local_f8 = '\0', 0x1c < uStack_fc)) {
        free(local_118.indirect_contents.indirect);
        local_118.indirect_contents.indirect = (char *)0x0;
      }
LAB_003b2874:
    } while (pvStack_190 != local_198);
  }
  if ((long)local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
            super__Vector_impl_data._M_start != 0x20) {
    __assert_fail("results.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                  ,0x27e,
                  "std::optional<Result> miniscript::Node<unsigned int>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = unsigned int, Result = CScript, State = bool, DownFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:731:23), UpFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:664:13)]"
                 );
  }
  pcVar11 = ((local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
              super__Vector_impl_data._M_start)->super_CScriptBase)._union.indirect_contents.
            indirect;
  local_a8._16_4_ =
       *(undefined4 *)
        ((long)&((local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                  super__Vector_impl_data._M_start)->super_CScriptBase)._union + 0x18);
  local_a8.indirect_contents.indirect =
       (char *)*(undefined8 *)
                ((long)&((local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                          super__Vector_impl_data._M_start)->super_CScriptBase)._union + 8);
  uVar17 = *(undefined8 *)
            ((long)&((local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                      super__Vector_impl_data._M_start)->super_CScriptBase)._union + 0x10);
  local_a8.indirect_contents.capacity = (size_type)uVar17;
  local_a8._12_4_ = (undefined4)((ulong)uVar17 >> 0x20);
  uVar5 = ((local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
            super__Vector_impl_data._M_start)->super_CScriptBase)._size;
  ((local_1b8.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.super__Vector_impl_data.
   _M_start)->super_CScriptBase)._size = 0;
  std::vector<CScript,_std::allocator<CScript>_>::~vector(&local_1b8);
  if (local_198 != (void *)0x0) {
    operator_delete(local_198,local_188 - (long)local_198);
  }
  local_138._16_8_ = CONCAT44(local_a8._12_4_,local_a8.indirect_contents.capacity);
  local_138._8_8_ = local_a8.indirect_contents.indirect;
  local_138._24_4_ = local_a8._16_4_;
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.indirect_contents.indirect = pcVar11;
  local_11c = uVar5;
  std::vector<CScript,_std::allocator<CScript>_>::reserve(__return_storage_ptr__,1);
  std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
            (__return_storage_ptr__,(CScript *)&local_138.indirect_contents);
  if (0x1c < local_11c) {
    free(local_138.indirect_contents.indirect);
    local_138.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript> scripts,
                                     FlatSigningProvider& provider) const override
    {
        const auto script_ctx{m_node->GetMsCtx()};
        for (const auto& key : keys) {
            if (miniscript::IsTapscript(script_ctx)) {
                provider.pubkeys.emplace(Hash160(XOnlyPubKey{key}), key);
            } else {
                provider.pubkeys.emplace(key.GetID(), key);
            }
        }
        return Vector(m_node->ToScript(ScriptMaker(keys, script_ctx)));
    }